

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O3

void __thiscall dlib::resizable_tensor::clear(resizable_tensor *this)

{
  void *pvVar1;
  _func_void_void_ptr *p_Var2;
  
  (this->super_tensor).m_size = 0;
  (this->super_tensor).m_n = 0;
  (this->super_tensor).m_k = 0;
  (this->super_tensor).m_nr = 0;
  (this->super_tensor).m_nc = 0;
  if ((long)(this->data_instance).data_size < 0) {
    gpu_data::set_size(&this->data_instance,0);
  }
  pvVar1 = (this->_annotation).storage.ptr;
  p_Var2 = (this->_annotation).storage.del;
  (this->_annotation).storage.ptr = (void *)0x0;
  (this->_annotation).storage.type_id_ = (_func_type_index *)0x0;
  (this->_annotation).storage.del = (_func_void_void_ptr *)0x0;
  (this->_annotation).storage.copy = (_func_void_ptr_void_ptr *)0x0;
  if (pvVar1 != (void *)0x0) {
    (*p_Var2)(pvVar1);
  }
  gpu_data::set_size(&this->data_instance,0);
  return;
}

Assistant:

void clear(
        )
        {
            set_size(0,0,0,0);
            _annotation.clear();
            // free underlying memory
            data_instance.set_size(0);
        }